

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O0

void __thiscall
OPN2::reset(OPN2 *this,int emulator,unsigned_long PCM_RATE,OPNFamily family,void *audioTickHandler)

{
  value_type __x;
  undefined8 uVar1;
  OPNFamily f;
  ulong uVar2;
  uint uVar3;
  OPNChipBase *pOVar4;
  reference pAVar5;
  byte bVar6;
  OPNChipBase *local_118;
  ulong local_90;
  size_t chip_1;
  uint8_t regLFOSetup;
  YmFmOPN2 *local_60;
  OPNChipBase *chip;
  size_t i;
  AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_> local_40;
  void *local_30;
  void *audioTickHandler_local;
  unsigned_long uStack_20;
  OPNFamily family_local;
  unsigned_long PCM_RATE_local;
  OPN2 *pOStack_10;
  int emulator_local;
  OPN2 *this_local;
  
  local_30 = audioTickHandler;
  audioTickHandler_local._4_4_ = family;
  uStack_20 = PCM_RATE;
  PCM_RATE_local._4_4_ = emulator;
  pOStack_10 = this;
  clearChips(this);
  std::vector<OpnTimbre,_std::allocator<OpnTimbre>_>::clear(&this->m_insCache);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_regLFOSens);
  if ((PCM_RATE_local._4_4_ == 7) && (2 < this->m_numChips)) {
    this->m_numChips = 2;
  }
  std::
  vector<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  ::clear(&this->m_chips);
  uVar3 = this->m_numChips;
  AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::AdlMIDI_SPtr
            (&local_40,(OPNChipBase *)0x0);
  std::
  vector<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  ::resize(&this->m_chips,(ulong)uVar3,&local_40);
  AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::~AdlMIDI_SPtr(&local_40);
  this->m_loopStartHook = (_func_void_void_ptr *)0x0;
  this->m_loopStartHookData = (void *)0x0;
  this->m_loopEndHook = (_func_void_void_ptr *)0x0;
  this->m_loopEndHookData = (void *)0x0;
  for (chip = (OPNChipBase *)0x0;
      pOVar4 = (OPNChipBase *)
               std::
               vector<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
               ::size(&this->m_chips), chip < pOVar4;
      chip = (OPNChipBase *)((long)&chip->_vptr_OPNChipBase + 1)) {
    switch(PCM_RATE_local._4_4_) {
    case 0:
      local_60 = (YmFmOPN2 *)operator_new(0x40);
      MameOPN2::MameOPN2((MameOPN2 *)local_60,audioTickHandler_local._4_4_);
      break;
    case 1:
      local_60 = (YmFmOPN2 *)operator_new(0x40);
      NukedOPN2::NukedOPN2((NukedOPN2 *)local_60,audioTickHandler_local._4_4_,true);
      break;
    case 2:
      local_60 = (YmFmOPN2 *)operator_new(0x440);
      GensOPN2::GensOPN2((GensOPN2 *)local_60,audioTickHandler_local._4_4_);
      break;
    case 3:
      local_60 = (YmFmOPN2 *)operator_new(0x1000);
      YmFmOPN2::YmFmOPN2(local_60,audioTickHandler_local._4_4_);
      break;
    case 4:
      local_60 = (YmFmOPN2 *)operator_new(0x440);
      NP2OPNA<FM::OPNA>::NP2OPNA((NP2OPNA<FM::OPNA> *)local_60,audioTickHandler_local._4_4_);
      break;
    case 5:
      local_60 = (YmFmOPN2 *)operator_new(0x440);
      MameOPNA::MameOPNA((MameOPNA *)local_60,audioTickHandler_local._4_4_);
      break;
    case 6:
      local_60 = (YmFmOPN2 *)operator_new(0x58);
      YmFmOPNA::YmFmOPNA((YmFmOPNA *)local_60,audioTickHandler_local._4_4_);
      break;
    case 7:
      local_60 = (YmFmOPN2 *)operator_new(0x4a0);
      f = audioTickHandler_local._4_4_;
      if (chip == (OPNChipBase *)0x0) {
        local_118 = (OPNChipBase *)0x0;
      }
      else {
        pAVar5 = std::
                 vector<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                 ::operator[](&this->m_chips,0);
        local_118 = AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::get(pAVar5);
      }
      VGMFileDumper::VGMFileDumper((VGMFileDumper *)local_60,f,(uint32_t)chip,local_118);
      if (chip == (OPNChipBase *)0x0) {
        this->m_loopStartHook = VGMFileDumper::loopStartHook;
        this->m_loopStartHookData = local_60;
        this->m_loopEndHook = VGMFileDumper::loopEndHook;
        this->m_loopEndHookData = local_60;
      }
      break;
    case 8:
      local_60 = (YmFmOPN2 *)operator_new(0x40);
      NukedOPN2::NukedOPN2((NukedOPN2 *)local_60,audioTickHandler_local._4_4_,false);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi_opn2.cpp"
                    ,0x27e,"void OPN2::reset(int, unsigned long, OPNFamily, void *)");
    }
    pAVar5 = std::
             vector<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
             ::operator[](&this->m_chips,(size_type)chip);
    AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::reset
              (pAVar5,(OPNChipBase *)local_60);
    OPNChipBase::setChipId((OPNChipBase *)local_60,(uint32_t)chip);
    uVar2 = uStack_20;
    uVar3 = (*(((OPNChipBaseBufferedT<GensOPN2,_256U> *)&local_60->super_OPNChipBaseT<YmFmOPN2>)->
              super_OPNChipBaseT<GensOPN2>).super_OPNChipBase._vptr_OPNChipBase[3])();
    (*(((OPNChipBaseBufferedT<GensOPN2,_256U> *)&local_60->super_OPNChipBaseT<YmFmOPN2>)->
      super_OPNChipBaseT<GensOPN2>).super_OPNChipBase._vptr_OPNChipBase[7])
              (local_60,uVar2 & 0xffffffff,(ulong)uVar3);
    if ((this->m_runAtPcmRate & 1U) != 0) {
      (*(((OPNChipBaseBufferedT<GensOPN2,_256U> *)&local_60->super_OPNChipBaseT<YmFmOPN2>)->
        super_OPNChipBaseT<GensOPN2>).super_OPNChipBase._vptr_OPNChipBase[6])(local_60,1);
    }
    audioTickHandler_local._4_4_ =
         (*(((OPNChipBaseBufferedT<GensOPN2,_256U> *)&local_60->super_OPNChipBaseT<YmFmOPN2>)->
           super_OPNChipBaseT<GensOPN2>).super_OPNChipBase._vptr_OPNChipBase[2])();
  }
  this->m_chipFamily = audioTickHandler_local._4_4_;
  this->m_numChannels = this->m_numChips * 6;
  uVar1 = m_emptyInstrument.op[0].OPS._0_8_;
  __x.OPS[1].data[1] = m_emptyInstrument.op[0].OPS[1].data[1];
  __x.OPS[1].data[2] = m_emptyInstrument.op[0].OPS[1].data[2];
  __x.OPS[1].data[3] = m_emptyInstrument.op[0].OPS[1].data[3];
  __x.OPS[1].data[4] = m_emptyInstrument.op[0].OPS[1].data[4];
  __x.OPS[1].data[5] = m_emptyInstrument.op[0].OPS[1].data[5];
  __x.OPS[1].data[6] = m_emptyInstrument.op[0].OPS[1].data[6];
  __x.OPS[2].data[0] = m_emptyInstrument.op[0].OPS[2].data[0];
  __x.OPS[2].data[1] = m_emptyInstrument.op[0].OPS[2].data[1];
  __x.OPS[0].data[0] = m_emptyInstrument.op[0].OPS[0].data[0];
  __x.OPS[0].data[1] = m_emptyInstrument.op[0].OPS[0].data[1];
  __x.OPS[0].data[2] = m_emptyInstrument.op[0].OPS[0].data[2];
  __x.OPS[0].data[3] = m_emptyInstrument.op[0].OPS[0].data[3];
  __x.OPS[0].data[4] = m_emptyInstrument.op[0].OPS[0].data[4];
  __x.OPS[0].data[5] = m_emptyInstrument.op[0].OPS[0].data[5];
  __x.OPS[0].data[6] = m_emptyInstrument.op[0].OPS[0].data[6];
  __x.OPS[1].data[0] = m_emptyInstrument.op[0].OPS[1].data[0];
  __x.OPS[2].data[2] = m_emptyInstrument.op[0].OPS[2].data[2];
  __x.OPS[2].data[3] = m_emptyInstrument.op[0].OPS[2].data[3];
  __x.OPS[2].data[4] = m_emptyInstrument.op[0].OPS[2].data[4];
  __x.OPS[2].data[5] = m_emptyInstrument.op[0].OPS[2].data[5];
  __x.OPS[2].data[6] = m_emptyInstrument.op[0].OPS[2].data[6];
  __x.OPS[3].data[0] = m_emptyInstrument.op[0].OPS[3].data[0];
  __x.OPS[3].data[1] = m_emptyInstrument.op[0].OPS[3].data[1];
  __x.OPS[3].data[2] = m_emptyInstrument.op[0].OPS[3].data[2];
  __x.OPS[3].data[3] = m_emptyInstrument.op[0].OPS[3].data[3];
  __x.OPS[3].data[4] = m_emptyInstrument.op[0].OPS[3].data[4];
  __x.OPS[3].data[5] = m_emptyInstrument.op[0].OPS[3].data[5];
  __x.OPS[3].data[6] = m_emptyInstrument.op[0].OPS[3].data[6];
  __x.fbalg = m_emptyInstrument.op[0].fbalg;
  __x.lfosens = m_emptyInstrument.op[0].lfosens;
  __x.noteOffset = m_emptyInstrument.op[0].noteOffset;
  m_emptyInstrument.op[0].OPS._0_8_ = uVar1;
  std::vector<OpnTimbre,_std::allocator<OpnTimbre>_>::resize
            (&this->m_insCache,(ulong)this->m_numChannels,__x);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_regLFOSens,(ulong)this->m_numChannels,'\0');
  bVar6 = 0;
  if ((this->m_lfoEnable & 1U) != 0) {
    bVar6 = 8;
  }
  bVar6 = bVar6 | this->m_lfoFrequency & 7;
  this->m_regLFOSetup = bVar6;
  for (local_90 = 0; local_90 < this->m_numChips; local_90 = local_90 + 1) {
    writeReg(this,local_90,'\0','\"',bVar6);
    writeReg(this,local_90,'\0','\'','\0');
    writeReg(this,local_90,'\0','+','\0');
    writeReg(this,local_90,'\0','(','\0');
    writeReg(this,local_90,'\0','(','\x01');
    writeReg(this,local_90,'\0','(','\x02');
    writeReg(this,local_90,'\0','(','\x04');
    writeReg(this,local_90,'\0','(','\x05');
    writeReg(this,local_90,'\0','(','\x06');
  }
  silenceAll(this);
  if (this->m_loopStartHook != (_func_void_void_ptr *)0x0) {
    (*this->m_loopStartHook)(this->m_loopStartHookData);
  }
  return;
}

Assistant:

void OPN2::reset(int emulator, unsigned long PCM_RATE, OPNFamily family, void *audioTickHandler)
{
#if !defined(ADLMIDI_AUDIO_TICK_HANDLER)
    ADL_UNUSED(audioTickHandler);
#endif
    clearChips();
    m_insCache.clear();
    m_regLFOSens.clear();
#ifdef OPNMIDI_MIDI2VGM
    if(emulator == OPNMIDI_VGM_DUMPER && (m_numChips > 2))
        m_numChips = 2;// VGM Dumper can't work in multichip mode
#endif
    m_chips.clear();
    m_chips.resize(m_numChips, AdlMIDI_SPtr<OPNChipBase>());

#ifdef OPNMIDI_MIDI2VGM
    m_loopStartHook = NULL;
    m_loopStartHookData = NULL;
    m_loopEndHook = NULL;
    m_loopEndHookData = NULL;
#endif

    for(size_t i = 0; i < m_chips.size(); i++)
    {
        OPNChipBase *chip = NULL;

        switch(emulator)
        {
        default:
            assert(false);
            abort();
#ifndef OPNMIDI_DISABLE_MAME_EMULATOR
        case OPNMIDI_EMU_MAME:
            chip = new MameOPN2(family);
            break;
#endif
#ifndef OPNMIDI_DISABLE_NUKED_EMULATOR
        case OPNMIDI_EMU_NUKED_YM3438:
            chip = new NukedOPN2(family, true);
            break;
        case OPNMIDI_EMU_NUKED_YM2612:
            chip = new NukedOPN2(family, false);
            break;
#endif
#ifndef OPNMIDI_DISABLE_GENS_EMULATOR
        case OPNMIDI_EMU_GENS:
            chip = new GensOPN2(family);
            break;
#endif
#ifndef OPNMIDI_DISABLE_YMFM_EMULATOR
        case OPNMIDI_EMU_YMFM_OPN2:
            chip = new YmFmOPN2(family);
            break;
#endif
//#ifndef OPNMIDI_DISABLE_GX_EMULATOR
//        case OPNMIDI_EMU_GX:
//            chip = new GXOPN2(family);
//            break;
//#endif
#ifndef OPNMIDI_DISABLE_NP2_EMULATOR
        case OPNMIDI_EMU_NP2:
            chip = new NP2OPNA<>(family);
            break;
#endif
#ifndef OPNMIDI_DISABLE_MAME_2608_EMULATOR
        case OPNMIDI_EMU_MAME_2608:
            chip = new MameOPNA(family);
            break;
#endif
#ifndef OPNMIDI_DISABLE_YMFM_EMULATOR
        case OPNMIDI_EMU_YMFM_OPNA:
            chip = new YmFmOPNA(family);
            break;
#endif
//#ifndef OPNMIDI_DISABLE_PMDWIN_EMULATOR
//        case OPNMIDI_EMU_PMDWIN:
//            chip = new PMDWinOPNA(family);
//            break;
//#endif
#ifdef OPNMIDI_MIDI2VGM
        case OPNMIDI_VGM_DUMPER:
            chip = new VGMFileDumper(family, i, (i == 0 ? NULL : m_chips[0].get()));
            if(i == 0)//Set hooks for first chip only
            {
                m_loopStartHook = &VGMFileDumper::loopStartHook;
                m_loopStartHookData = chip;
                m_loopEndHook  = &VGMFileDumper::loopEndHook;
                m_loopEndHookData = chip;
            }
            break;
#endif
        }

        m_chips[i].reset(chip);
        chip->setChipId(static_cast<uint32_t>(i));
        chip->setRate(static_cast<uint32_t>(PCM_RATE), chip->nativeClockRate());

        if(m_runAtPcmRate)
            chip->setRunningAtPcmRate(true);

#if defined(ADLMIDI_AUDIO_TICK_HANDLER)
        chip->setAudioTickHandlerInstance(audioTickHandler);
#endif
        family = chip->family();
    }

    m_chipFamily = family;
    m_numChannels = m_numChips * 6;
    m_insCache.resize(m_numChannels,   m_emptyInstrument.op[0]);
    m_regLFOSens.resize(m_numChannels,    0);

    uint8_t regLFOSetup = (m_lfoEnable ? 8 : 0) | (m_lfoFrequency & 7);
    m_regLFOSetup = regLFOSetup;

    for(size_t chip = 0; chip < m_numChips; ++chip)
    {
        writeReg(chip, 0, 0x22, regLFOSetup);//push current LFO state
        writeReg(chip, 0, 0x27, 0x00);  //set Channel 3 normal mode
        writeReg(chip, 0, 0x2B, 0x00);  //Disable DAC
        //Shut up all channels
        writeReg(chip, 0, 0x28, 0x00); //Note Off 0 channel
        writeReg(chip, 0, 0x28, 0x01); //Note Off 1 channel
        writeReg(chip, 0, 0x28, 0x02); //Note Off 2 channel
        writeReg(chip, 0, 0x28, 0x04); //Note Off 3 channel
        writeReg(chip, 0, 0x28, 0x05); //Note Off 4 channel
        writeReg(chip, 0, 0x28, 0x06); //Note Off 5 channel
    }

    silenceAll();
#ifdef OPNMIDI_MIDI2VGM
    if(m_loopStartHook) // Post-initialization Loop Start hook (fix for loop edge passing clicks)
        m_loopStartHook(m_loopStartHookData);
#endif
}